

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_filter_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4045ec::AV1HighbdSelfguidedFilterTest_CorrectnessTest_Test::TestBody
          (AV1HighbdSelfguidedFilterTest_CorrectnessTest_Test *this)

{
  int width;
  int bit_depth;
  uint16_t *puVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  ParamType *pPVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_short *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint16_t *puVar11;
  uint uVar12;
  int iVar13;
  SEARCH_METHODS *pSVar14;
  unsigned_short *rhs;
  long lVar15;
  unsigned_short *puVar16;
  long lVar17;
  unsigned_short *lhs;
  int xqd [2];
  int32_t *tmpbuf;
  AssertionResult gtest_ar;
  uint16_t *output2_;
  AssertHelper local_f8;
  uint16_t *output_;
  uint local_e8;
  ACMRandom rnd;
  AssertHelper local_d8;
  int local_d0;
  uint32_t local_cc;
  int local_c8;
  int local_c4;
  unsigned_short *local_c0;
  unsigned_short *local_b8;
  unsigned_short *local_b0;
  unsigned_short *local_a8;
  uint16_t *local_a0;
  unsigned_short *local_98;
  uint16_t *local_90;
  uint16_t *input_;
  uint16_t *local_80;
  ulong local_78;
  uint16_t *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  AV1HighbdSelfguidedFilterTest_CorrectnessTest_Test *local_48;
  ulong local_40;
  unsigned_short *local_38;
  
  pPVar5 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  (this->super_AV1HighbdSelfguidedFilterTest).tst_fun_ =
       (SgrFunc)(pPVar5->
                super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
                ).
                super__Head_base<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_false>
                ._M_head_impl;
  local_48 = this;
  pPVar5 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  uVar12 = (pPVar5->
           super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
           ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  local_50 = (ulong)uVar12;
  input_ = (uint16_t *)aom_memalign(0x20,0x5fd00);
  output_ = (uint16_t *)0x0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            ((internal *)&gtest_ar,"input_","nullptr",&input_,&output_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&output_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar14 = "";
    }
    else {
      pSVar14 = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output2_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
               ,0x157,(char *)pSVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output2_,(Message *)&output_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output2_);
    if (output_ != (uint16_t *)0x0) {
      (**(code **)(*(long *)output_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    output_ = (uint16_t *)aom_memalign(0x20,0x5fd00);
    output2_ = (uint16_t *)0x0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              ((internal *)&gtest_ar,"output_","nullptr",&output_,&output2_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&output2_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar14 = "";
      }
      else {
        pSVar14 = *(SEARCH_METHODS **)
                   gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tmpbuf,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                 ,0x15a,(char *)pSVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tmpbuf,(Message *)&output2_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tmpbuf);
      if (output2_ != (uint16_t *)0x0) {
        (**(code **)(*(long *)output2_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      output2_ = (uint16_t *)aom_memalign(0x20,0x5fd00);
      tmpbuf = (int32_t *)0x0;
      testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                ((internal *)&gtest_ar,"output2_","nullptr",&output2_,&tmpbuf);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tmpbuf);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar14 = "";
        }
        else {
          pSVar14 = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)xqd,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                   ,0x15d,(char *)pSVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)xqd,(Message *)&tmpbuf);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)xqd);
        if (tmpbuf != (int32_t *)0x0) {
          (**(code **)(*(long *)tmpbuf + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        tmpbuf = (int32_t *)aom_memalign(0x20,0x13b9a0);
        xqd[0] = 0;
        xqd[1] = 0;
        testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                  ((internal *)&gtest_ar,"tmpbuf","nullptr",&tmpbuf,(void **)xqd);
        if (gtest_ar.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          puVar11 = input_;
          local_b8 = output_ + 0x2a10;
          local_c0 = output2_ + 0x2a10;
          rnd.random_.state_ = (Random)0xbaba;
          av1_loop_restoration_precal();
          uVar12 = ~(-1 << ((byte)uVar12 & 0x1f));
          local_70 = puVar11 + 0x2a10;
          uVar9 = 0;
          iVar13 = 0x104;
          local_80 = puVar11;
          local_e8 = uVar12;
          do {
            lVar15 = -0x10;
            if ((int)uVar9 == 0x51) {
              aom_free(input_);
              aom_free(output_);
              aom_free(output2_);
              aom_free(tmpbuf);
              return;
            }
            iVar3 = (int)(uVar9 / 9);
            uVar7 = (ulong)(0x104 - iVar3);
            local_68 = (ulong)(uint)(iVar3 * 9 + iVar13);
            puVar11 = local_80;
            local_d0 = iVar13;
            local_78 = uVar9;
            for (; lVar15 != 0x114; lVar15 = lVar15 + 1) {
              for (lVar17 = 0; lVar17 != 0x124; lVar17 = lVar17 + 1) {
                uVar2 = libaom_test::ACMRandom::Rand16(&rnd);
                puVar11[lVar17] = uVar2 & (ushort)uVar12;
              }
              puVar11 = puVar11 + 0x2a0;
            }
            uVar4 = testing::internal::Random::Generate(&rnd.random_,0x80);
            xqd[0] = uVar4 - 0x60;
            uVar4 = testing::internal::Random::Generate(&rnd.random_,0x80);
            xqd[1] = uVar4 - 0x20;
            local_cc = testing::internal::Random::Generate(&rnd.random_,0x10);
            local_60 = (ulong)(0x104 - (int)(uVar9 % 9));
            local_a0 = local_70;
            local_a8 = local_b8;
            local_b0 = local_c0;
            uVar9 = 0;
            while (uVar9 < local_60) {
              local_c8 = (int)local_60 - (int)uVar9;
              if (0x3f < local_c8) {
                local_c8 = 0x40;
              }
              local_98 = local_b0;
              uVar10 = 0;
              uVar6 = uVar7;
              puVar8 = local_a8;
              puVar11 = local_a0;
              local_58 = uVar9;
              while (iVar13 = local_c8, uVar4 = local_cc, iVar3 = (int)uVar6, uVar10 < uVar7) {
                width = 0x40;
                if (iVar3 < 0x40) {
                  width = iVar3;
                }
                bit_depth = (int)local_50;
                local_c4 = iVar3;
                local_90 = puVar11;
                local_40 = uVar10;
                local_38 = puVar8;
                (*(local_48->super_AV1HighbdSelfguidedFilterTest).tst_fun_)
                          ((uint8_t *)((ulong)puVar11 >> 1),width,local_c8,0x2a0,local_cc,xqd,
                           (uint8_t *)((ulong)puVar8 >> 1),0x2a0,tmpbuf,bit_depth,1);
                puVar1 = local_90;
                puVar8 = local_98;
                av1_apply_selfguided_restoration_c
                          ((uint8_t *)((ulong)puVar11 >> 1),width,iVar13,0x2a0,uVar4,xqd,
                           (uint8_t *)((ulong)local_98 >> 1),0x2a0,tmpbuf,bit_depth,1);
                local_98 = puVar8 + 0x40;
                puVar8 = local_38 + 0x40;
                puVar11 = puVar1 + 0x40;
                uVar6 = (ulong)(local_c4 - 0x40);
                uVar10 = local_40 + 0x40;
              }
              local_b0 = local_b0 + 0xa800;
              local_a8 = local_a8 + 0xa800;
              local_a0 = local_a0 + 0xa800;
              uVar12 = local_e8;
              uVar9 = local_58 + 0x40;
            }
            puVar8 = local_b8;
            puVar16 = local_c0;
            for (uVar9 = 0; uVar6 = uVar7, rhs = puVar16, lhs = puVar8, uVar9 != local_68;
                uVar9 = uVar9 + 1) {
              while (uVar6 != 0) {
                testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                          ((internal *)&gtest_ar,"output[j * out_stride + k]",
                           "output2[j * out_stride + k]",lhs,rhs);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_f8);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pSVar14 = "";
                  }
                  else {
                    pSVar14 = *(SEARCH_METHODS **)
                               gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                             ,0x189,(char *)pSVar14);
                  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_f8);
                  testing::internal::AssertHelper::~AssertHelper(&local_d8);
                  if (local_f8.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_f8.data_ + 8))();
                  }
                  goto LAB_00467c67;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                uVar6 = uVar6 - 1;
                rhs = rhs + 1;
                lhs = lhs + 1;
              }
              puVar16 = puVar16 + 0x2a0;
              puVar8 = puVar8 + 0x2a0;
              uVar12 = local_e8;
            }
            uVar9 = (ulong)((int)local_78 + 1);
            iVar13 = local_d0 + -1;
          } while( true );
        }
        testing::Message::Message((Message *)xqd);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar14 = "";
        }
        else {
          pSVar14 = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                   ,0x15f,(char *)pSVar14);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)xqd);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        if (xqd != (int  [2])0x0) {
          (**(code **)(*(long *)xqd + 8))();
        }
      }
    }
  }
LAB_00467c67:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(AV1HighbdSelfguidedFilterTest, CorrectnessTest) { RunCorrectnessTest(); }